

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoSimulateBack(Gia_IsoMan_t *p,int Iter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint *puVar13;
  int *piVar14;
  long lVar15;
  
  pGVar4 = p->pGia;
  pVVar5 = pGVar4->vCos;
  iVar1 = pVVar5->nSize;
  if ((long)iVar1 < 1) {
    uVar9 = pGVar4->nObjs;
  }
  else {
    piVar14 = pVVar5->pArray;
    lVar12 = 0;
    do {
      lVar15 = (long)piVar14[lVar12];
      if ((lVar15 < 0) || (uVar9 = pGVar4->nObjs, (int)uVar9 <= piVar14[lVar12])) goto LAB_0075125c;
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = pGVar4->pObjs + lVar15;
      if (Iter == 0) {
        uVar8 = p->pLevels[lVar15];
        if ((int)uVar8 < 0) goto LAB_0075129a;
LAB_0075104d:
        iVar10 = (uVar8 + 1) *
                 s_256Primes[((uint)(*(ulong *)pGVar6 >> 0x1d) & 1) + (uVar8 & 0x7f) * 2];
      }
      else {
        uVar8 = p->pUniques[lVar15];
        if (0 < (int)uVar8) goto LAB_0075104d;
        iVar10 = 0;
      }
      pGVar6[-(ulong)((uint)*(ulong *)pGVar6 & 0x1fffffff)].Value =
           pGVar6[-(ulong)((uint)*(ulong *)pGVar6 & 0x1fffffff)].Value + iVar10 + pGVar6->Value;
      lVar12 = lVar12 + 1;
    } while (iVar1 != lVar12);
  }
  if (1 < (int)uVar9) {
    pGVar6 = pGVar4->pObjs;
    uVar11 = (ulong)uVar9 + 1;
    puVar13 = &pGVar6[(ulong)uVar9 - 1].Value;
    do {
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      uVar7 = *(ulong *)(puVar13 + -2);
      if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
        if (Iter == 0) {
          uVar8 = p->pLevels[uVar11 - 2];
          if ((int)uVar8 < 0) {
LAB_0075129a:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
LAB_0075110d:
          iVar10 = (uVar8 + 1) * s_256Primes[((uint)(uVar7 >> 0x1d) & 1) + (uVar8 & 0x7f) * 2];
        }
        else {
          uVar8 = p->pUniques[uVar11 - 2];
          if (0 < (int)uVar8) goto LAB_0075110d;
          iVar10 = 0;
        }
        piVar14 = (int *)((long)puVar13 + (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3);
        *piVar14 = *piVar14 + iVar10 + *puVar13;
        if (Iter == 0) {
          uVar8 = p->pLevels[uVar11 - 2];
          if ((int)uVar8 < 0) goto LAB_0075129a;
LAB_0075116e:
          iVar10 = (uVar8 + 1) * s_256Primes[((uint)(uVar7 >> 0x3d) & 1) + (uVar8 & 0x7f) * 2];
        }
        else {
          uVar8 = p->pUniques[uVar11 - 2];
          if (0 < (int)uVar8) goto LAB_0075116e;
          iVar10 = 0;
        }
        piVar14 = (int *)((long)puVar13 + (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3);
        *piVar14 = *piVar14 + iVar10 + *puVar13;
      }
      uVar11 = uVar11 - 1;
      puVar13 = puVar13 + -3;
    } while (2 < uVar11);
  }
  iVar10 = pGVar4->nRegs;
  lVar12 = (long)iVar10;
  if (0 < lVar12) {
    uVar11 = (ulong)(uint)(iVar1 - iVar10);
    iVar10 = -iVar10;
LAB_007511d7:
    if ((iVar1 + iVar10 < 0) || (iVar1 <= iVar1 + iVar10)) {
LAB_0075127b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = pVVar5->pArray[uVar11];
    if (((long)iVar2 < 0) || ((int)uVar9 <= iVar2)) {
LAB_0075125c:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar6 = pGVar4->pObjs;
    if (pGVar6 != (Gia_Obj_t *)0x0) {
      iVar3 = pGVar4->vCis->nSize;
      uVar8 = iVar10 + iVar3;
      if (((int)uVar8 < 0) || (iVar3 <= (int)uVar8)) goto LAB_0075127b;
      uVar8 = pGVar4->vCis->pArray[uVar8];
      if (((long)(int)uVar8 < 0) || (uVar9 <= uVar8)) goto LAB_0075125c;
      pGVar6[iVar2].Value = pGVar6[iVar2].Value + pGVar6[(int)uVar8].Value;
      iVar10 = iVar10 + 1;
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + -1;
      if (lVar12 != 0) goto LAB_007511d7;
    }
  }
  return;
}

Assistant:

void Gia_IsoSimulateBack( Gia_IsoMan_t * p, int Iter )
{
    Gia_Obj_t * pObj, * pObjF;
    int i, iObj;
    // simulate COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        Gia_ObjFanin0(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, iObj, Gia_ObjFaninC0(pObj));
    }
    // simulate objects
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        Gia_ObjFanin0(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, i, Gia_ObjFaninC0(pObj));
        Gia_ObjFanin1(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, i, Gia_ObjFaninC1(pObj));
    }
    // transfer flop values
    Gia_ManForEachRiRo( p->pGia, pObjF, pObj, i )
        pObjF->Value += pObj->Value;
}